

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_fsp.cpp
# Opt level: O2

void * __thiscall
ON_FixedSizePoolIterator::NextBlock(ON_FixedSizePoolIterator *this,size_t *block_element_count)

{
  undefined8 *puVar1;
  ON_FixedSizePool *this_00;
  void *block;
  size_t sVar2;
  void *pvVar3;
  
  puVar1 = (undefined8 *)this->m_it_block;
  if (((puVar1 != (undefined8 *)0x0) &&
      (this_00 = this->m_fsp, puVar1 != (undefined8 *)this_00->m_al_block)) &&
     ((undefined8 *)this->m_it_element == puVar1 + 2)) {
    block = (void *)*puVar1;
    this->m_it_block = block;
    if (block != this_00->m_al_element_array) {
      pvVar3 = (void *)((long)block + 0x10);
      this->m_it_element = pvVar3;
      if (block_element_count == (size_t *)0x0) {
        return pvVar3;
      }
      sVar2 = ON_FixedSizePool::BlockElementCount(this_00,block);
      goto LAB_004aa836;
    }
  }
  sVar2 = 0;
  this->m_it_block = (void *)0x0;
  this->m_it_element = (void *)0x0;
  pvVar3 = (void *)0x0;
  if (block_element_count == (size_t *)0x0) {
    return (void *)0x0;
  }
LAB_004aa836:
  *block_element_count = sVar2;
  return pvVar3;
}

Assistant:

void* ON_FixedSizePoolIterator::NextBlock( size_t* block_element_count )
{
  if ( 0 != m_it_block
       && m_it_block != m_fsp->m_al_block
       && m_it_element == (void*)(((char*)m_it_block)+2*sizeof(void*)) )
  {
    m_it_block = *((void**)m_it_block);
    if ( m_it_block == m_fsp->m_al_element_array )
    {
      m_it_block = 0;
      m_it_element = 0;
      if ( 0 != block_element_count )
        *block_element_count = 0;
    }
    else
    {
      m_it_element = (void*)(((char*)m_it_block)+2*sizeof(void*)); // m_it_element points to first element in m_first_block
      if ( 0 != block_element_count )
        *block_element_count = m_fsp->BlockElementCount(m_it_block);
    }
  }
  else
  {
    m_it_block = 0;
    m_it_element = 0;
    if ( 0 != block_element_count )
      *block_element_count = 0;
  }
  return m_it_element;
}